

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex_nodes.h
# Opt level: O0

void __thiscall
alex::AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::
Iterator<const_alex::AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>,_const_int,_const_std::pair<int,_int>_>
::operator++(Iterator<const_alex::AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>,_const_int,_const_std::pair<int,_int>_>
             *this,int param_2)

{
  int iVar1;
  uint64_t uVar2;
  long *in_RDI;
  uint64_t bit;
  uint64_t in_stack_ffffffffffffffd8;
  
  while( true ) {
    if (in_RDI[2] != 0) {
      extract_rightmost_one(in_RDI[2]);
      iVar1 = get_offset((int)((ulong)in_RDI >> 0x20),in_stack_ffffffffffffffd8);
      *(int *)(in_RDI + 1) = iVar1;
      uVar2 = remove_rightmost_one(in_RDI[2]);
      in_RDI[2] = uVar2;
      return;
    }
    *(int *)((long)in_RDI + 0xc) = *(int *)((long)in_RDI + 0xc) + 1;
    if (*(int *)(*in_RDI + 0x68) <= *(int *)((long)in_RDI + 0xc)) break;
    in_RDI[2] = *(long *)(*(long *)(*in_RDI + 0x60) + (long)*(int *)((long)in_RDI + 0xc) * 8);
  }
  *(undefined4 *)(in_RDI + 1) = 0xffffffff;
  return;
}

Assistant:

void operator++(int) {
      while (cur_bitmap_data_ == 0) {
        cur_bitmap_idx_++;
        if (cur_bitmap_idx_ >= node_->bitmap_size_) {
          cur_idx_ = -1;
          return;
        }
        cur_bitmap_data_ = node_->bitmap_[cur_bitmap_idx_];
      }
      uint64_t bit = extract_rightmost_one(cur_bitmap_data_);
      cur_idx_ = get_offset(cur_bitmap_idx_, bit);
      cur_bitmap_data_ = remove_rightmost_one(cur_bitmap_data_);
    }